

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O1

Vec_Int_t * Gia_ManCollectDoms(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  ulong uVar4;
  size_t sVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  size_t __nmemb;
  uint Entry;
  bool bVar9;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  uVar4 = (ulong)(uint)p->nObjs;
  if (0 < p->nObjs) {
    uVar8 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if ((p->pObjs[uVar8].field_0x7 & 0x40) != 0) {
        if (p->pRefs != (int *)0x0) {
          if ((long)(int)uVar4 <= (long)uVar8) goto LAB_005765c6;
          if (p->pRefs[uVar8] == 0) goto LAB_00576494;
        }
        if ((long)(int)uVar4 <= (long)uVar8) {
LAB_005765c6:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        if ((long)p->vDoms->nSize <= (long)uVar8) {
LAB_005765a7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar4 = (ulong)(uint)p->vDoms->pArray[uVar8];
        if (uVar8 != uVar4 && uVar4 != 0xffffffff) {
          uVar6 = 0;
          do {
            Entry = (uint)uVar4;
            if (((int)Entry < 0) || (p->nObjs <= (int)Entry)) {
LAB_00576588:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            uVar1 = (uint)*(undefined8 *)(p->pObjs + uVar4);
            if (((int)uVar1 < 0) || ((uVar1 & 0x1fffffff) == 0x1fffffff)) break;
            Vec_IntPush(p_00,Entry);
            if (p->nObjs <= (int)Entry) goto LAB_00576588;
            if (p->vDoms->nSize <= (int)Entry) goto LAB_005765a7;
            uVar1 = p->vDoms->pArray[uVar4];
            if (uVar1 == Entry) break;
            uVar4 = (ulong)uVar1;
            bVar9 = uVar6 < 999999999;
            uVar6 = uVar6 + 1;
          } while (bVar9);
        }
      }
LAB_00576494:
      uVar8 = uVar8 + 1;
      uVar4 = (ulong)p->nObjs;
    } while ((long)uVar8 < (long)uVar4);
  }
  __nmemb = (size_t)p_00->nSize;
  if (1 < (long)__nmemb) {
    piVar3 = p_00->pArray;
    qsort(piVar3,__nmemb,4,Vec_IntSortCompare1);
    iVar2 = 1;
    sVar5 = 1;
    do {
      if (piVar3[sVar5] != piVar3[sVar5 - 1]) {
        lVar7 = (long)iVar2;
        iVar2 = iVar2 + 1;
        piVar3[lVar7] = piVar3[sVar5];
      }
      sVar5 = sVar5 + 1;
    } while (__nmemb != sVar5);
    p_00->nSize = iVar2;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManCollectDoms( Gia_Man_t * p )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int Lev, LevMax = ABC_INFINITY;
    int i, iDom, iDomNext;
    vNodes = Vec_IntAlloc( 100 );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( !pObj->fMark1 )
            continue;
        if ( p->pRefs && Gia_ObjRefNum(p, pObj) == 0 )
            continue;
        iDom = Gia_ObjDom(p, pObj);
        if ( iDom == -1 )
            continue;
        if ( iDom == i )
            continue;
        for ( Lev = 0; Lev < LevMax && Gia_ObjIsAnd( Gia_ManObj(p, iDom) ); Lev++ )
        {
            Vec_IntPush( vNodes, iDom );
            iDomNext = Gia_ObjDom( p, Gia_ManObj(p, iDom) );
            if ( iDomNext == iDom )
                break;
            iDom = iDomNext;
        }
    }
    Vec_IntUniqify( vNodes );
    return vNodes;
}